

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O0

int opj_getopt_long(int argc,char **argv,char *optstring,opj_option_t *longopts,int totlen)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  opj_option_t *local_58;
  opj_option_t *o;
  char *arg;
  int iStack_3c;
  char param;
  int len;
  int i;
  char *tmp;
  int totlen_local;
  opj_option_t *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  arg._7_1_ = 1;
  while( true ) {
    if (((argc <= opj_optind) || (argv[opj_optind] == (char *)0x0)) || (*argv[opj_optind] != '-')) {
      return -1;
    }
    if ((*argv[opj_optind] == '-') && (argv[opj_optind][1] == '\0')) {
      if (opj_optind < argc + -1) {
        if (*argv[opj_optind + 1] == '-') {
          arg._7_1_ = 0;
        }
        else {
          arg._7_1_ = 2;
        }
      }
      else {
        arg._7_1_ = 0;
      }
    }
    if (arg._7_1_ == 0) {
      opj_optind = opj_optind + 1;
      return 0x3f;
    }
    if (*argv[opj_optind] != '-') {
      fprintf(_stderr,"Invalid option\n");
      opj_optind = opj_optind + 1;
      return 0x3f;
    }
    if (arg._7_1_ < 2) {
      o = (opj_option_t *)(argv[opj_optind] + 1);
    }
    else {
      o = (opj_option_t *)argv[opj_optind + 1];
      opj_optind = opj_optind + 1;
    }
    sVar2 = strlen((char *)o);
    if (1 < sVar2) {
      iStack_3c = 0;
      local_58 = longopts;
      while( true ) {
        if (totlen <= iStack_3c) {
          fprintf(_stderr,"Invalid option %s\n",o);
          opj_optind = opj_optind + 1;
          return 0x3f;
        }
        iVar1 = strcmp(local_58->name,(char *)o);
        if (iVar1 == 0) break;
        iStack_3c = iStack_3c + 0x20;
        local_58 = local_58 + 1;
      }
      if (local_58->has_arg == 0) {
        if ((argv[opj_optind + 1] != (char *)0x0) && (*argv[opj_optind + 1] != '-')) {
          fprintf(_stderr,"%s: option does not require an argument. Ignoring %s\n",o,
                  argv[opj_optind + 1]);
          opj_optind = opj_optind + 1;
        }
      }
      else {
        opj_optarg = argv[opj_optind + 1];
        if (((opj_optarg != (char *)0x0) && (*opj_optarg == '-')) && (opj_opterr != 0)) {
          fprintf(_stderr,"%s: option requires an argument\n",o);
          return 0x3f;
        }
        if (((opj_optarg == (char *)0x0) && (local_58->has_arg == 1)) && (opj_opterr != 0)) {
          fprintf(_stderr,"%s: option requires an argument \n",o);
          return 0x3f;
        }
        opj_optind = opj_optind + 1;
      }
      opj_optind = opj_optind + 1;
      if (local_58->flag != (int *)0x0) {
        *local_58->flag = local_58->val;
        return 0;
      }
      return local_58->val;
    }
    if (*optstring == ':') {
      return 0x3a;
    }
    if (opj_getopt_long::lastidx != opj_optind) {
      opj_getopt_long::lastidx = opj_optind;
      opj_getopt_long::lastofs = 0;
    }
    opj_optopt = (int)argv[opj_optind][opj_getopt_long::lastofs + 1];
    pcVar3 = strchr(optstring,opj_optopt);
    if (pcVar3 == (char *)0x0) break;
    if (*pcVar3 != '\0') {
      if (pcVar3[1] != ':') {
        opj_getopt_long::lastofs = opj_getopt_long::lastofs + 1;
        return opj_optopt;
      }
      if ((pcVar3[2] == ':') || (argv[opj_optind][opj_getopt_long::lastofs + 2] != '\0')) {
        opj_optarg = argv[opj_optind] + (long)opj_getopt_long::lastofs + 2;
        if (argv[opj_optind][(long)opj_getopt_long::lastofs + 2] == '\0') {
          opj_optarg = (char *)0x0;
        }
      }
      else {
        opj_optarg = argv[opj_optind + 1];
        if (((opj_optarg != (char *)0x0) && (*opj_optarg == '-')) && (opj_opterr != 0)) {
          fprintf(_stderr,"%s: option requires an argument\n",o);
          return 0x3f;
        }
        if ((opj_optarg == (char *)0x0) && (opj_opterr != 0)) {
          fprintf(_stderr,"%s: option requires an argument\n",o);
          return 0x3f;
        }
        opj_optind = opj_optind + 1;
      }
      opj_optind = opj_optind + 1;
      return opj_optopt;
    }
    opj_optind = opj_optind + 1;
  }
  fprintf(_stderr,"Invalid option %s\n",o);
  opj_optind = opj_optind + 1;
  return 0x3f;
}

Assistant:

int opj_getopt_long(int argc, char * const argv[], const char *optstring,
const opj_option_t *longopts, int totlen) {
	static int lastidx,lastofs;
	const char *tmp;
	int i,len;
	char param = 1;

again:
	if (opj_optind >= argc || !argv[opj_optind] || *argv[opj_optind]!='-')
		return -1;

	if (argv[opj_optind][0]=='-' && argv[opj_optind][1]==0) {
		if(opj_optind >= (argc - 1)){ /* no more input parameters */
			param = 0;
		}
		else{ /* more input parameters */
			if(argv[opj_optind + 1][0] == '-'){
				param = 0; /* Missing parameter after '-' */
			}
			else{
				param = 2;
			}
		}
	}

	if (param == 0) {
		++opj_optind;
		return (BADCH);
	}

	if (argv[opj_optind][0]=='-') {	/* long option */
		char* arg=argv[opj_optind]+1;
		const opj_option_t* o;
		o=longopts;
		len=sizeof(longopts[0]);

		if (param > 1){
			arg = argv[opj_optind+1];
			opj_optind++;
		}
		else
			arg = argv[opj_optind]+1;

		if(strlen(arg)>1){
			for (i=0;i<totlen;i=i+len,o++) {
				if (!strcmp(o->name,arg)) {	/* match */
					if (o->has_arg == 0) {
						if ((argv[opj_optind+1])&&(!(argv[opj_optind+1][0]=='-'))){
							fprintf(stderr,"%s: option does not require an argument. Ignoring %s\n",arg,argv[opj_optind+1]);
							++opj_optind;
						}
					}else{ 
						opj_optarg=argv[opj_optind+1];
						if(opj_optarg){
							if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */								
								if (opj_opterr) {
									fprintf(stderr,"%s: option requires an argument\n",arg);
									return (BADCH);
								}
							}
						}
						if (!opj_optarg && o->has_arg==1) {	/* no argument there */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument \n",arg);
								return (BADCH);
							}
						}
						++opj_optind;
					}
					++opj_optind;
					if (o->flag)
						*(o->flag)=o->val;
					else
						return o->val;
					return 0;
				}
			}/*(end for)String not found in the list*/
			fprintf(stderr,"Invalid option %s\n",arg);
			++opj_optind;
			return (BADCH);
		}else{ /*Single character input parameter*/
			if (*optstring==':') return ':';
			if (lastidx!=opj_optind) {
				lastidx=opj_optind; lastofs=0;
			}
			opj_optopt=argv[opj_optind][lastofs+1];
			if ((tmp=strchr(optstring,opj_optopt))) {/*Found input parameter in list*/
				if (*tmp==0) {	/* apparently, we looked for \0, i.e. end of argument */
					++opj_optind;
					goto again;
				}
				if (tmp[1]==':') {	/* argument expected */
					if (tmp[2]==':' || argv[opj_optind][lastofs+2]) {	/* "-foo", return "oo" as opj_optarg */
						if (!*(opj_optarg=argv[opj_optind]+lastofs+2)) opj_optarg=0;
						goto found;
					}
					opj_optarg=argv[opj_optind+1];
					if(opj_optarg){
						if (opj_optarg[0] == '-'){ /* Has read next input parameter: No arg for current parameter */
							if (opj_opterr) {
								fprintf(stderr,"%s: option requires an argument\n",arg);
								return (BADCH);
							}
						}
					}
					if (!opj_optarg) {	/* missing argument */
						if (opj_opterr) {
							fprintf(stderr,"%s: option requires an argument\n",arg);
							return (BADCH);
						}
					}
					++opj_optind;
				}else {/*Argument not expected*/
					++lastofs;
					return opj_optopt;
				}
found:
				++opj_optind;
				return opj_optopt;
			}	else {	/* not found */
				fprintf(stderr,"Invalid option %s\n",arg);
				++opj_optind;
				return (BADCH);
			}/*end of not found*/
		
		}/* end of single character*/
	}/*end '-'*/
	fprintf(stderr,"Invalid option\n");
	++opj_optind;
	return (BADCH);;
}